

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::iterate(CreateContextExtCase *this)

{
  WindowParams *this_00;
  EGLConfig config_00;
  EGLDisplay pvVar1;
  int iVar2;
  deUint32 err;
  Visibility visibility_;
  size_type sVar3;
  Library *egl_00;
  reference ppvVar4;
  TestLog *pTVar5;
  char *pcVar6;
  undefined4 extraout_var;
  EGLSurface pvVar7;
  NativeDisplayFactory *pNVar8;
  CommandLine *pCVar9;
  NativeWindowFactory *pNVar10;
  NativeDisplay *pNVar11;
  NativeWindow *window_00;
  NativePixmapFactory *pNVar12;
  undefined8 uVar13;
  NativePixmap *pixmap_00;
  TestError *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_358;
  undefined1 local_1d8 [8];
  UniqueSurface surface_2;
  undefined1 local_1b8 [8];
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> pixmap;
  NativePixmapFactory *factory_1;
  UniqueSurface surface_1;
  undefined1 local_178 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  NativeWindowFactory *factory;
  UniqueSurface surface;
  EGLint attribList [5];
  allocator<char> local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  allocator<char> local_c5 [13];
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  ScopedLogSection local_38;
  ScopedLogSection section;
  EGLint configId;
  EGLint surfaceTypes;
  EGLConfig config;
  Library *egl;
  CreateContextExtCase *this_local;
  
  if (this->m_iteration == 0) {
    logAttribList(this);
    checkRequiredExtensions(this);
  }
  iVar2 = this->m_iteration;
  sVar3 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_configs);
  if (iVar2 < (int)sVar3) {
    egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_configs,(long)this->m_iteration);
    config_00 = *ppvVar4;
    section.m_log._4_4_ = eglu::getConfigAttribInt(egl_00,this->m_display,config_00,0x3033);
    section.m_log._0_4_ = eglu::getConfigAttribInt(egl_00,this->m_display,config_00,0x3028);
    if ((section.m_log._4_4_ & 1) == 0) {
      if ((section.m_log._4_4_ & 4) == 0) {
        if ((section.m_log._4_4_ & 2) == 0) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Invalid or empty surface type bits",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x39e);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pNVar8 = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
        pCVar9 = tcu::TestContext::getCommandLine
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        pNVar12 = eglu::selectNativePixmapFactory(pNVar8,pCVar9);
        pixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data.
        _8_8_ = pNVar12;
        pNVar11 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
        uVar13 = (**(code **)(*(long *)pNVar12 + 0x20))
                           (pNVar12,pNVar11,this->m_display,config_00,0,0x100,0x100);
        de::DefaultDeleter<eglu::NativePixmap>::DefaultDeleter
                  ((DefaultDeleter<eglu::NativePixmap> *)((long)&surface_2.m_surface + 7));
        de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
        UniquePtr((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                  local_1b8,uVar13);
        pvVar1 = this->m_display;
        pNVar11 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
        pixmap_00 = de::details::
                    UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
                    operator*((UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>
                               *)local_1b8);
        pvVar7 = eglu::createPixmapSurface
                           (pNVar11,pixmap_00,this->m_display,config_00,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_1d8,egl_00,pvVar1,pvVar7);
        pvVar7 = eglu::UniqueSurface::operator*((UniqueSurface *)local_1d8);
        executeForSurface(this,config_00,pvVar7);
        eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_1d8);
        de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
        ~UniquePtr((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                   local_1b8);
      }
      else {
        pNVar8 = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
        pCVar9 = tcu::TestContext::getCommandLine
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        pNVar10 = eglu::selectNativeWindowFactory(pNVar8,pCVar9);
        window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
        _8_8_ = pNVar10;
        pNVar11 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
        pvVar1 = this->m_display;
        pCVar9 = tcu::TestContext::getCommandLine
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        visibility_ = eglu::parseWindowVisibility(pCVar9);
        this_00 = (WindowParams *)((long)&surface_1.m_surface + 4);
        eglu::WindowParams::WindowParams(this_00,0x100,0x100,visibility_);
        iVar2 = (*(pNVar10->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                          (pNVar10,pNVar11,pvVar1,config_00,0,this_00);
        de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
                  ((DefaultDeleter<eglu::NativeWindow> *)((long)&surface_1.m_surface + 3));
        de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
        UniquePtr((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                  local_178,iVar2);
        pvVar1 = this->m_display;
        pNVar11 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
        window_00 = de::details::
                    UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
                    operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                               *)local_178);
        pvVar7 = eglu::createWindowSurface
                           (pNVar11,window_00,this->m_display,config_00,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface((UniqueSurface *)&factory_1,egl_00,pvVar1,pvVar7);
        pvVar7 = eglu::UniqueSurface::operator*((UniqueSurface *)&factory_1);
        executeForSurface(this,config_00,pvVar7);
        eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&factory_1);
        de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
        ~UniquePtr((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                   local_178);
      }
    }
    else {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      de::toString<int>(&local_b8,(int *)&section);
      std::operator+(&local_98,"EGLConfig ID: ",&local_b8);
      std::operator+(&local_78,&local_98," with PBuffer");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar6,local_c5);
      de::toString<int>(&local_128,(int *)&section);
      std::operator+(&local_108,"EGLConfig ID: ",&local_128);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar6,&local_129);
      tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar5,&local_58,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_129);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(local_c5);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      surface.m_surface._0_4_ = 0x3057;
      surface.m_surface._4_4_ = 0x40;
      pvVar1 = this->m_display;
      iVar2 = (*egl_00->_vptr_Library[10])(egl_00,pvVar1,config_00,&surface.m_surface);
      eglu::UniqueSurface::UniqueSurface
                ((UniqueSurface *)&factory,egl_00,pvVar1,(EGLSurface)CONCAT44(extraout_var,iVar2));
      err = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(err,"eglCreatePbufferSurface",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                       ,0x387);
      pvVar7 = eglu::UniqueSurface::operator*((UniqueSurface *)&factory);
      executeForSurface(this,config_00,pvVar7);
      eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&factory);
      tcu::ScopedLogSection::~ScopedLogSection(&local_38);
    }
    this->m_iteration = this->m_iteration + 1;
    this_local._4_4_ = CONTINUE;
  }
  else {
    sVar3 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_configs);
    if (sVar3 == 0) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      this_02 = tcu::MessageBuilder::operator<<
                          (&local_358,(char (*) [27])"No supported configs found");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_358);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_NOT_SUPPORTED,"No supported configs found");
    }
    else if ((this->m_isOk & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult CreateContextExtCase::iterate (void)
{
	if (m_iteration == 0)
	{
		logAttribList();
		checkRequiredExtensions();
	}

	if (m_iteration < (int)m_configs.size())
	{
		const Library&		egl				= m_eglTestCtx.getLibrary();
		const EGLConfig		config			= m_configs[m_iteration];
		const EGLint		surfaceTypes	= eglu::getConfigAttribInt(egl, m_display, config, EGL_SURFACE_TYPE);
		const EGLint		configId		= eglu::getConfigAttribInt(egl, m_display, config, EGL_CONFIG_ID);

		if ((surfaceTypes & EGL_PBUFFER_BIT) != 0)
		{
			tcu::ScopedLogSection	section			(m_testCtx.getLog(), ("EGLConfig ID: " + de::toString(configId) + " with PBuffer").c_str(), ("EGLConfig ID: " + de::toString(configId)).c_str());
			const EGLint			attribList[]	=
			{
				EGL_WIDTH,	64,
				EGL_HEIGHT,	64,
				EGL_NONE
			};
			eglu::UniqueSurface		surface			(egl, m_display, egl.createPbufferSurface(m_display, config, attribList));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_WINDOW_BIT) != 0)
		{
			const eglu::NativeWindowFactory&	factory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, eglu::WindowParams(256, 256, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_PIXMAP_BIT) != 0)
		{
			const eglu::NativePixmapFactory&	factory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativePixmap>	pixmap	(factory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, 256, 256));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else // No supported surface type
			TCU_FAIL("Invalid or empty surface type bits");

		m_iteration++;
		return CONTINUE;
	}
	else
	{
		if (m_configs.size() == 0)
		{
			m_testCtx.getLog() << TestLog::Message << "No supported configs found" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "No supported configs found");
		}
		else if (m_isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
}